

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

InterCode * __thiscall
IrSim::icBinOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t,C_OP *a1,C_OP *a2)

{
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  
  Operand::Operand((Operand *)local_80,t);
  Operand::Operand((Operand *)local_b0,a1);
  Operand::Operand((Operand *)local_50,a2);
  InterCode::InterCode
            (__return_storage_ptr__,kind,(Operand *)local_80,(Operand *)local_b0,(Operand *)local_50
            );
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)(local_b0 + 8));
  std::__cxx11::string::~string((string *)(local_80 + 8));
  return __return_storage_ptr__;
}

Assistant:

InterCode icBinOp(int kind, C_OP &t, C_OP &a1, C_OP &a2) const { return InterCode(kind, t, a1, a2); }